

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int lua_yield(lua_State *L,int nresults)

{
  byte bVar1;
  uint64_t uVar2;
  TValue *t;
  TValue *pTVar3;
  uint *puVar4;
  TValue *pTVar5;
  TValue TVar6;
  uint uVar7;
  
  if (((ulong)L->cframe & 1) == 0) {
    lj_err_msg(L,LJ_ERR_CYIELD);
  }
  uVar2 = (L->glref).ptr64;
  bVar1 = *(byte *)(uVar2 + 0x91);
  if ((bVar1 & 0x10) == 0) {
    pTVar3 = L->base;
    pTVar5 = L->top + -(long)nresults;
    if (pTVar3 < pTVar5) {
      if (0 < nresults) {
        uVar7 = nresults + 1;
        do {
          TVar6 = *pTVar5;
          pTVar5 = pTVar5 + 1;
          *pTVar3 = TVar6;
          pTVar3 = pTVar3 + 1;
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
      }
      L->top = pTVar3;
    }
    L->cframe = (void *)0x0;
    L->status = '\x01';
    return -1;
  }
  puVar4 = (uint *)((ulong)L->cframe & 0xfffffffffffffffc);
  pTVar5 = L->top;
  *(byte *)(uVar2 + 0x91) = bVar1 & 0xef;
  TVar6.field_4.it = 0;
  TVar6.field_4.i = *puVar4;
  *pTVar5 = TVar6;
  pTVar5[1].n = (lua_Number)lj_cont_hook;
  pTVar5[2].u64 = *(long *)(puVar4 + 6) - 4;
  pTVar5[3].u64 = (ulong)L | 0xfffc800000000000;
  pTVar3 = pTVar5 + 5;
  pTVar5[4].u64 = (long)pTVar3 + (2 - (long)L->base);
  L->base = pTVar3;
  L->top = pTVar3;
  lj_err_throw(L,1);
}

Assistant:

LUA_API int lua_yield(lua_State *L, int nresults)
{
  void *cf = L->cframe;
  global_State *g = G(L);
  if (cframe_canyield(cf)) {
    cf = cframe_raw(cf);
    if (!hook_active(g)) {  /* Regular yield: move results down if needed. */
      cTValue *f = L->top - nresults;
      if (f > L->base) {
	TValue *t = L->base;
	while (--nresults >= 0) copyTV(L, t++, f++);
	L->top = t;
      }
      L->cframe = NULL;
      L->status = LUA_YIELD;
      return -1;
    } else {  /* Yield from hook: add a pseudo-frame. */
      TValue *top = L->top;
      hook_leave(g);
      (top++)->u64 = cframe_multres(cf);
      setcont(top, lj_cont_hook);
      if (LJ_FR2) top++;
      setframe_pc(top, cframe_pc(cf)-1);
      top++;
      setframe_gc(top, obj2gco(L), LJ_TTHREAD);
      if (LJ_FR2) top++;
      setframe_ftsz(top, ((char *)(top+1)-(char *)L->base)+FRAME_CONT);
      L->top = L->base = top+1;
#if ((defined(__GNUC__) || defined(__clang__)) && (LJ_TARGET_X64 || defined(LUAJIT_UNWIND_EXTERNAL)) && !LJ_NO_UNWIND) || LJ_TARGET_WINDOWS
      lj_err_throw(L, LUA_YIELD);
#else
      L->cframe = NULL;
      L->status = LUA_YIELD;
      lj_vm_unwind_c(cf, LUA_YIELD);
#endif
    }
  }
  lj_err_msg(L, LJ_ERR_CYIELD);
  return 0;  /* unreachable */
}